

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_conversions1.cpp
# Opt level: O1

void __thiscall Temperature_Reaumur_Test::~Temperature_Reaumur_Test(Temperature_Reaumur_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Temperature, Reaumur)
{
    using namespace units;
    auto re = precise::temperature::reaumur;

    EXPECT_TRUE(is_temperature(re));
    EXPECT_NEAR(convert(313.15, K, re), 32.0, test::tolerance);
    EXPECT_NEAR(convert(32.0, re, precise::degC), 40.0, test::tolerance);
    EXPECT_NEAR(convert(40.0, precise::degC, re), 32.0, test::tolerance);
    EXPECT_NEAR(
        convert(563.67, precise::temperature::rankine, re),
        32.0,
        test::tolerance);
    EXPECT_NEAR(convert(32.0, re, degF), 104.0, test::tolerance);
}